

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLComment * __thiscall tinyxml2::XMLDocument::NewComment(XMLDocument *this,char *str)

{
  XMLNode *this_00;
  XMLComment *comment;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = &CreateUnlinkedNode<tinyxml2::XMLComment,104>(this,&this->_commentPool)->super_XMLNode;
  XMLNode::SetValue(this_00,str,false);
  return (XMLComment *)this_00;
}

Assistant:

XMLComment* XMLDocument::NewComment(const char* str)
{
    XMLComment* comment = CreateUnlinkedNode<XMLComment>(_commentPool);
    comment->SetValue(str);
    return comment;
}